

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void input(State *state)

{
  char cVar1;
  microseconds atTime;
  double dVar2;
  Timeline timeLine;
  Clock<1> local_99;
  _Head_base<0UL,_double,_false> local_98;
  Timeline local_90;
  Timeline local_58;
  
  cVar1 = std::istream::get();
  ableton::Link::captureAppTimeline(&local_90,&state->link);
  local_98._M_head_impl =
       (double)local_90.mTimeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
               super__Head_base<0UL,_double,_false>._M_head_impl;
  atTime = ableton::platforms::linux::Clock<1>::micros(&local_99);
  switch((int)cVar1) {
  case 0x71:
    LOCK();
    (state->running)._M_base._M_i = false;
    UNLOCK();
    clearLine();
    return;
  case 0x72:
    dVar2 = state->quantum + -1.0;
    break;
  case 0x73:
  case 0x75:
  case 0x76:
    goto switchD_0016b2a9_caseD_73;
  case 0x74:
    dVar2 = state->quantum + 1.0;
    break;
  case 0x77:
    dVar2 = local_98._M_head_impl + -1.0;
    goto LAB_0016b2ee;
  default:
    if (cVar1 != 0x65) goto switchD_0016b2a9_caseD_73;
    dVar2 = local_98._M_head_impl + 1.0;
LAB_0016b2ee:
    ableton::Link::Timeline::setTempo(&local_90,dVar2,atTime);
    goto switchD_0016b2a9_caseD_73;
  }
  state->quantum = dVar2;
switchD_0016b2a9_caseD_73:
  local_58.mTimeline.timeOrigin.__r = local_90.mTimeline.timeOrigin.__r;
  local_58.mTimeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       local_90.mTimeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  local_58.mTimeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl =
       local_90.mTimeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
       super__Head_base<0UL,_long,_false>._M_head_impl;
  local_58.mOriginalTimeline.timeOrigin.__r = local_90.mOriginalTimeline.timeOrigin.__r;
  local_58.mbRespectQuantum = local_90.mbRespectQuantum;
  local_58._25_7_ = local_90._25_7_;
  local_58.mOriginalTimeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
  super__Head_base<0UL,_double,_false>._M_head_impl =
       local_90.mOriginalTimeline.tempo.super_tuple<double>.super__Tuple_impl<0UL,_double>.
       super__Head_base<0UL,_double,_false>._M_head_impl;
  local_58.mOriginalTimeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
  super__Head_base<0UL,_long,_false>._M_head_impl =
       local_90.mOriginalTimeline.beatOrigin.super_tuple<long>.super__Tuple_impl<0UL,_long>.
       super__Head_base<0UL,_long,_false>._M_head_impl;
  ableton::Link::commitAppTimeline(&state->link,&local_58);
  input(state);
  return;
}

Assistant:

void input(State& state)
{
  char in;

#if defined(LINK_PLATFORM_WINDOWS)
  HANDLE stdinHandle = GetStdHandle(STD_INPUT_HANDLE);
  DWORD numCharsRead;
  INPUT_RECORD inputRecord;
  do
  {
    ReadConsoleInput(stdinHandle, &inputRecord, 1, &numCharsRead);
  } while ((inputRecord.EventType != KEY_EVENT) || inputRecord.Event.KeyEvent.bKeyDown);
  in = inputRecord.Event.KeyEvent.uChar.AsciiChar;
#elif defined(LINK_PLATFORM_UNIX)
  in = std::cin.get();
#endif
  auto timeLine = state.link.captureAppTimeline();
  const auto tempo = timeLine.tempo();

  std::chrono::microseconds updateAt = state.link.clock().micros();

  switch (in)
  {
    case 'q':
      state.running = false;
      clearLine();
      return;
    case 'w':
      timeLine.setTempo(tempo-1,updateAt);
      break;
    case 'e':
      timeLine.setTempo(tempo+1,updateAt);
      break;
    case 'r':
      state.quantum -= 1;
      break;
    case 't':
      state.quantum += 1;
      break;
  }
  state.link.commitAppTimeline(timeLine);
  input(state);
}